

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O3

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::~op_queue
          (op_queue<asio::detail::scheduler_operation> *this)

{
  scheduler_operation *psVar1;
  error_category *peVar2;
  scheduler_operation *tmp;
  scheduler_operation *psVar3;
  error_code local_30;
  
  psVar3 = this->front_;
  if (psVar3 != (scheduler_operation *)0x0) {
    peVar2 = (error_category *)std::_V2::system_category();
    do {
      psVar1 = psVar3->next_;
      this->front_ = psVar1;
      if (psVar1 == (scheduler_operation *)0x0) {
        this->back_ = (scheduler_operation *)0x0;
      }
      psVar3->next_ = (scheduler_operation *)0x0;
      local_30._M_value = 0;
      local_30._M_cat = peVar2;
      (*psVar3->func_)((void *)0x0,psVar3,&local_30,0);
      psVar3 = this->front_;
    } while (psVar3 != (scheduler_operation *)0x0);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }